

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallProgramsCommand.cxx
# Opt level: O1

void __thiscall cmInstallProgramsCommand::FinalPass(cmInstallProgramsCommand *this)

{
  pointer *ppbVar1;
  cmMakefile *pcVar2;
  int iVar3;
  MessageLevel message;
  char *pcVar4;
  cmInstallFilesGenerator *this_00;
  pointer pbVar5;
  _Alloc_hider _Var6;
  bool bVar7;
  allocator local_89;
  string destination;
  string no_component;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  no_configurations;
  
  pbVar5 = (this->FinalArgs).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pbVar5 == (this->FinalArgs).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    bVar7 = false;
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)pbVar5);
    bVar7 = iVar3 == 0;
  }
  pbVar5 = (this->FinalArgs).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((bVar7 == false) &&
     ((ulong)((long)(this->FinalArgs).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar5) < 0x21)) {
    no_component._M_dataplus._M_p = (pointer)0x0;
    no_component._M_string_length = 0;
    no_component.field_2._M_allocated_capacity = 0;
    pcVar4 = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
    std::__cxx11::string::string((string *)&destination,pcVar4,(allocator *)&no_configurations);
    cmSystemTools::Glob(&destination,
                        (this->FinalArgs).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&no_component);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)destination._M_dataplus._M_p != &destination.field_2) {
      operator_delete(destination._M_dataplus._M_p,destination.field_2._M_allocated_capacity + 1);
    }
    if (no_component._M_dataplus._M_p != (pointer)no_component._M_string_length) {
      _Var6._M_p = no_component._M_dataplus._M_p;
      do {
        FindInstallSource_abi_cxx11_(&destination,this,*(char **)_Var6._M_p);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->Files
                   ,&destination);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)destination._M_dataplus._M_p != &destination.field_2) {
          operator_delete(destination._M_dataplus._M_p,destination.field_2._M_allocated_capacity + 1
                         );
        }
        _Var6._M_p = _Var6._M_p + 0x20;
      } while (_Var6._M_p != (pointer)no_component._M_string_length);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&no_component);
  }
  else {
    pbVar5 = pbVar5 + bVar7;
    if (pbVar5 != (this->FinalArgs).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        FindInstallSource_abi_cxx11_(&destination,this,(pbVar5->_M_dataplus)._M_p);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->Files
                   ,&destination);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)destination._M_dataplus._M_p != &destination.field_2) {
          operator_delete(destination._M_dataplus._M_p,destination.field_2._M_allocated_capacity + 1
                         );
        }
        pbVar5 = pbVar5 + 1;
      } while (pbVar5 != (this->FinalArgs).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
  }
  std::__cxx11::string::substr((ulong)&destination,(ulong)&this->Destination);
  cmsys::SystemTools::ConvertToUnixSlashes(&destination);
  if (destination._M_string_length == 0) {
    std::__cxx11::string::_M_replace((ulong)&destination,0,(char *)0x0,0x4b32b3);
  }
  pcVar2 = (this->super_cmCommand).Makefile;
  ppbVar1 = &no_configurations.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  no_configurations.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&no_configurations,"CMAKE_INSTALL_DEFAULT_COMPONENT_NAME","");
  pcVar4 = cmMakefile::GetSafeDefinition(pcVar2,(string *)&no_configurations);
  std::__cxx11::string::string((string *)&no_component,pcVar4,&local_89);
  if (no_configurations.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar1) {
    operator_delete(no_configurations.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((no_configurations.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  no_configurations.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  no_configurations.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  no_configurations.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  message = cmInstallGenerator::SelectMessageLevel((this->super_cmCommand).Makefile,false);
  pcVar2 = (this->super_cmCommand).Makefile;
  this_00 = (cmInstallFilesGenerator *)operator_new(0x120);
  cmInstallFilesGenerator::cmInstallFilesGenerator
            (this_00,pcVar2,&this->Files,destination._M_dataplus._M_p,true,"",&no_configurations,
             no_component._M_dataplus._M_p,message,"",false);
  cmMakefile::AddInstallGenerator(pcVar2,(cmInstallGenerator *)this_00);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&no_configurations);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)no_component._M_dataplus._M_p != &no_component.field_2) {
    operator_delete(no_component._M_dataplus._M_p,no_component.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)destination._M_dataplus._M_p != &destination.field_2) {
    operator_delete(destination._M_dataplus._M_p,destination.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmInstallProgramsCommand::FinalPass()
{
  bool files_mode = false;
  if(!this->FinalArgs.empty() && this->FinalArgs[0] == "FILES")
    {
    files_mode = true;
    }

  // two different options
  if (this->FinalArgs.size() > 1 || files_mode)
    {
    // for each argument, get the programs
    std::vector<std::string>::iterator s = this->FinalArgs.begin();
    if(files_mode)
      {
      // Skip the FILES argument in files mode.
      ++s;
      }
    for(;s != this->FinalArgs.end(); ++s)
      {
      // add to the result
      this->Files.push_back(this->FindInstallSource(s->c_str()));
      }
    }
  else     // reg exp list
    {
    std::vector<std::string> programs;
    cmSystemTools::Glob(this->Makefile->GetCurrentSourceDirectory(),
                        this->FinalArgs[0], programs);

    std::vector<std::string>::iterator s = programs.begin();
    // for each argument, get the programs
    for (;s != programs.end(); ++s)
      {
      this->Files.push_back(this->FindInstallSource(s->c_str()));
      }
    }

  // Construct the destination.  This command always installs under
  // the prefix.  We skip the leading slash given by the user.
  std::string destination = this->Destination.substr(1);
  cmSystemTools::ConvertToUnixSlashes(destination);
  if(destination.empty())
    {
    destination = ".";
    }

  // Use a file install generator.
  const char* no_permissions = "";
  const char* no_rename = "";
  std::string no_component = this->Makefile->GetSafeDefinition(
                                       "CMAKE_INSTALL_DEFAULT_COMPONENT_NAME");
  std::vector<std::string> no_configurations;
  cmInstallGenerator::MessageLevel message =
    cmInstallGenerator::SelectMessageLevel(this->Makefile);
  this->Makefile->AddInstallGenerator(
    new cmInstallFilesGenerator(this->Makefile, this->Files,
                                destination.c_str(), true,
                                no_permissions, no_configurations,
                                no_component.c_str(), message, no_rename));
}